

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  uint uVar1;
  size_t sVar2;
  IConfig *pIVar3;
  ITracker *pIVar4;
  Counts *in_RSI;
  long in_RDI;
  bool local_1;
  
  sVar2 = Counts::total(in_RSI);
  if (sVar2 == 0) {
    pIVar3 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0x108));
    uVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if ((uVar1 & 1) == 0) {
      local_1 = false;
    }
    else {
      pIVar4 = TestCaseTracking::TrackerContext::currentTracker((TrackerContext *)(in_RDI + 0x200));
      uVar1 = (*(pIVar4->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                _vptr_NonCopyable[8])();
      if ((uVar1 & 1) == 0) {
        *(long *)(in_RDI + 0x118) = *(long *)(in_RDI + 0x118) + 1;
        in_RSI->failed = in_RSI->failed + 1;
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool testForMissingAssertions( Counts& assertions ) {
            if( assertions.total() != 0 )
                return false;
            if( !m_config->warnAboutMissingAssertions() )
                return false;
            if( m_trackerContext.currentTracker().hasChildren() )
                return false;
            m_totals.assertions.failed++;
            assertions.failed++;
            return true;
        }